

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackTexture.cpp
# Opt level: O0

bool __thiscall
Rml::CallbackTextureInterface::GenerateTexture
          (CallbackTextureInterface *this,Span<const_unsigned_char> source,Vector2i new_dimensions)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  CallbackTextureInterface *this_local;
  Vector2i new_dimensions_local;
  Span<const_unsigned_char> source_local;
  
  if (*this->texture_handle == 0) {
    iVar3 = (*this->render_interface->_vptr_RenderInterface[6])
                      (this->render_interface,source.m_data,source.m_size,new_dimensions);
    *this->texture_handle = CONCAT44(extraout_var,iVar3);
    if (*this->texture_handle != 0) {
      *this->dimensions = new_dimensions;
    }
    source_local.m_size._7_1_ = *this->texture_handle != 0;
  }
  else {
    bVar2 = Assert("Texture already set",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/CallbackTexture.cpp"
                   ,0x39);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    source_local.m_size._7_1_ = false;
  }
  return source_local.m_size._7_1_;
}

Assistant:

bool CallbackTextureInterface::GenerateTexture(Span<const byte> source, Vector2i new_dimensions) const
{
	if (texture_handle)
	{
		RMLUI_ERRORMSG("Texture already set");
		return false;
	}
	texture_handle = render_interface.GenerateTexture(source, new_dimensions);
	if (texture_handle)
		dimensions = new_dimensions;
	return texture_handle != TextureHandle{};
}